

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<char> * __thiscall
cimg_library::CImg<char>::append(CImg<char> *this,CImg<char> *img,char axis,float align)

{
  bool bVar1;
  char *pcVar2;
  CImgList<char> local_58;
  CImg<char> local_48;
  float local_28;
  char local_21;
  float align_local;
  char axis_local;
  CImg<char> *img_local;
  CImg<char> *this_local;
  
  local_28 = align;
  local_21 = axis;
  _align_local = img;
  img_local = this;
  bVar1 = is_empty(this);
  if (bVar1) {
    this_local = assign<char>(this,_align_local,false);
  }
  else {
    pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)_align_local);
    this_local = this;
    if (pcVar2 != (char *)0x0) {
      CImgList<char>::CImgList<char,char>(&local_58,this,_align_local,true);
      CImgList<char>::get_append(&local_48,&local_58,local_21,local_28);
      this_local = move_to(&local_48,this);
      ~CImg(&local_48);
      CImgList<char>::~CImgList(&local_58);
    }
  }
  return this_local;
}

Assistant:

CImg<T>& append(const CImg<T>& img, const char axis='x', const float align=0) {
      if (is_empty()) return assign(img,false);
      if (!img) return *this;
      return CImgList<T>(*this,img,true).get_append(axis,align).move_to(*this);
    }